

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O0

char __thiscall
Assimp::LWOImporter::FindUVChannels
          (LWOImporter *this,TextureList *list,Layer *param_2,UVChannel *uv,uint next)

{
  bool bVar1;
  __type _Var2;
  reference pTVar3;
  Logger *this_00;
  Texture *texture;
  iterator __end1;
  iterator __begin1;
  TextureList *__range1;
  char ret;
  uint next_local;
  UVChannel *uv_local;
  Layer *param_2_local;
  TextureList *list_local;
  LWOImporter *this_local;
  
  __range1._3_1_ = '\0';
  __end1 = std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::begin
                     (list);
  texture = (Texture *)
            std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::end
                      (list);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&texture), bVar1) {
    pTVar3 = std::_List_iterator<Assimp::LWO::Texture>::operator*(&__end1);
    if (((((pTVar3->enabled & 1U) != 0) && ((pTVar3->bCanUse & 1U) != 0)) && (pTVar3->mapMode == UV)
        ) && (_Var2 = std::operator==(&pTVar3->mUVChannelIndex,&(uv->super_VMapEntry).name), _Var2))
    {
      __range1._3_1_ = '\x01';
      if ((pTVar3->mRealUVIndex == 0xffffffff) || (pTVar3->mRealUVIndex == next)) {
        pTVar3->mRealUVIndex = next;
      }
      else {
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,"LWO: Channel mismatch, would need to duplicate surface [design bug]");
      }
    }
    std::_List_iterator<Assimp::LWO::Texture>::operator++(&__end1);
  }
  return __range1._3_1_;
}

Assistant:

char LWOImporter::FindUVChannels(LWO::TextureList& list,
    LWO::Layer& /*layer*/,LWO::UVChannel& uv, unsigned int next)
{
    char ret = 0;
    for (auto &texture : list)  {

        // Ignore textures with non-UV mappings for the moment.
        if (!texture.enabled || !texture.bCanUse || texture.mapMode != LWO::Texture::UV)  {
            continue;
        }

        if (texture.mUVChannelIndex == uv.name) {
            ret = 1;

            // got it.
            if (texture.mRealUVIndex == UINT_MAX || texture.mRealUVIndex == next)
            {
                texture.mRealUVIndex = next;
            }
            else {
                // channel mismatch. need to duplicate the material.
                ASSIMP_LOG_WARN("LWO: Channel mismatch, would need to duplicate surface [design bug]");

                // TODO
            }
        }
    }
    return ret;
}